

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O2

ssl_open_record_t __thiscall
bssl::dtls1_open_app_data
          (bssl *this,SSL *ssl,Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,
          Span<unsigned_char> in)

{
  ushort *puVar1;
  Span<unsigned_char> in_00;
  Span<const_unsigned_char> data;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  ssl_open_record_t sVar5;
  uchar *in_R9;
  size_t *psVar6;
  Span<const_unsigned_char> record_00;
  size_t in_stack_ffffffffffffff58;
  uint8_t type;
  Span<unsigned_char> record;
  DTLSRecordNumber record_number;
  hm_header_st msg_hdr;
  CBS body;
  CBS cbs;
  
  iVar4 = SSL_in_init((SSL *)this);
  if (iVar4 != 0) {
    __assert_fail("!SSL_in_init(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xa3,
                  "ssl_open_record_t bssl::dtls1_open_app_data(SSL *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                 );
  }
  record_number.combined_ = 0;
  record.data_ = (uchar *)0x0;
  record.size_ = 0;
  in_00.size_ = in_stack_ffffffffffffff58;
  in_00.data_ = in_R9;
  psVar6 = out_consumed;
  sVar5 = dtls_open_record(this,(SSL *)&type,(uint8_t *)&record_number,(DTLSRecordNumber *)&record,
                           out,out_consumed,out_alert,in_00);
  if (sVar5 != ssl_open_record_success) {
    return sVar5;
  }
  if (type == '\x16') {
    uVar3 = ssl_protocol_version((SSL *)this);
    if (0x303 < uVar3) {
      record_00.size_ = (size_t)psVar6;
      record_00.data_ = (uchar *)record.size_;
      bVar2 = dtls1_process_handshake_fragments
                        (this,(SSL *)out_consumed,(uint8_t *)record_number.combined_,
                         (DTLSRecordNumber)record.data_,record_00);
      return (uint)!bVar2 + (uint)!bVar2 * 2 + ssl_open_record_discard;
    }
    cbs.data = record.data_;
    cbs.len = record.size_;
    bVar2 = dtls1_parse_fragment(&cbs,&msg_hdr,&body);
    if (!bVar2) {
      ERR_put_error(0x10,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                    ,0xc3);
      *(undefined1 *)out_consumed = 0x32;
      return ssl_open_record_error;
    }
    if ((msg_hdr.type == '\x14') &&
       (puVar1 = *(ushort **)(this + 0x38), puVar1[2] - 1 == (uint)msg_hdr.seq)) {
      if ((*puVar1 & 0x20) != 0) {
        return ssl_open_record_discard;
      }
      if (msg_hdr.frag_off == 0) {
        *(int *)(puVar1 + 0x1e6) = *(int *)(puVar1 + 0x1e6) + 1;
        *puVar1 = *puVar1 | 0x20;
        return ssl_open_record_discard;
      }
      return ssl_open_record_discard;
    }
  }
  if (type == '\x17') {
    if (record.size_ != 0) {
      ssl->method = (SSL_PROTOCOL_METHOD *)record.data_;
      (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl = (SSL_CONFIG *)record.size_;
      return ssl_open_record_success;
    }
    return ssl_open_record_discard;
  }
  if (type != '\x1a') {
    ERR_put_error(0x10,0,0xe1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xe0);
    *(undefined1 *)out_consumed = 10;
    return ssl_open_record_error;
  }
  data.size_ = record.size_;
  data.data_ = record.data_;
  sVar5 = dtls1_process_ack((SSL *)this,(uint8_t *)out_consumed,record_number,data);
  return sVar5;
}

Assistant:

ssl_open_record_t dtls1_open_app_data(SSL *ssl, Span<uint8_t> *out,
                                      size_t *out_consumed, uint8_t *out_alert,
                                      Span<uint8_t> in) {
  assert(!SSL_in_init(ssl));

  uint8_t type;
  DTLSRecordNumber record_number;
  Span<uint8_t> record;
  auto ret = dtls_open_record(ssl, &type, &record_number, &record, out_consumed,
                              out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  if (type == SSL3_RT_HANDSHAKE) {
    // Process handshake fragments for DTLS 1.3 post-handshake messages.
    if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (!dtls1_process_handshake_fragments(ssl, out_alert, record_number,
                                             record)) {
        return ssl_open_record_error;
      }
      return ssl_open_record_discard;
    }

    // Parse the first fragment header to determine if this is a pre-CCS or
    // post-CCS handshake record. DTLS resets handshake message numbers on each
    // handshake, so renegotiations and retransmissions are ambiguous.
    //
    // TODO(crbug.com/42290594): Move this logic into
    // |dtls1_process_handshake_fragments| and integrate it into DTLS 1.3
    // retransmit conditions.
    CBS cbs, body;
    struct hm_header_st msg_hdr;
    CBS_init(&cbs, record.data(), record.size());
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    if (msg_hdr.type == SSL3_MT_FINISHED &&
        msg_hdr.seq == ssl->d1->handshake_read_seq - 1) {
      if (!ssl->d1->sending_flight && msg_hdr.frag_off == 0) {
        // Retransmit our last flight of messages. If the peer sends the second
        // Finished, they may not have received ours. Only do this for the
        // first fragment, in case the Finished was fragmented.
        //
        // This is not really a timeout, but increment the timeout count so we
        // eventually give up.
        ssl->d1->num_timeouts++;
        ssl->d1->sending_flight = true;
      }
      return ssl_open_record_discard;
    }

    // Otherwise, this is a pre-CCS handshake message from an unsupported
    // renegotiation attempt. Fall through to the error path.
  }

  if (type == SSL3_RT_ACK) {
    return dtls1_process_ack(ssl, out_alert, record_number, record);
  }

  if (type != SSL3_RT_APPLICATION_DATA) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  if (record.empty()) {
    return ssl_open_record_discard;
  }

  *out = record;
  return ssl_open_record_success;
}